

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

ostream * log_info(void)

{
  ostream *poVar1;
  long *local_28;
  long local_20;
  long local_18 [2];
  
  if ((int)g_log_level < 3) {
    std::ios::clear((int)*(undefined8 *)(g_sink_stringstream_abi_cxx11_ + -0x18) + 0x23d500);
    poVar1 = (ostream *)&DAT_0023d510;
  }
  else {
    get_time_str_abi_cxx11_();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_28,local_20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," INFO ",6);
    if (local_28 != local_18) {
      operator_delete(local_28,local_18[0] + 1);
    }
  }
  return poVar1;
}

Assistant:

std::ostream &log_info()
{
  if (g_log_level >= log_level_info)
  {
    return std::cout << get_time_str() << " INFO ";
  }

  g_sink_stringstream.clear();
  return g_sink_stringstream;
}